

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CAssignSubscriptStm *stm)

{
  bool bVar1;
  pointer pCVar2;
  pointer pIVar3;
  CError local_328;
  TypeInfo local_2f8;
  TypeInfo local_2d0;
  CError local_2a8;
  TypeInfo local_278;
  undefined1 local_250 [8];
  string errorMessage_1;
  TypeInfo local_230;
  TypeInfo local_208;
  TypeInfo local_1e0;
  CError local_1b8;
  TypeInfo local_188;
  undefined1 local_160 [8];
  string errorMessage;
  TypeInfo local_140;
  TypeInfo local_118;
  undefined4 local_ec;
  TypeInfo local_e8;
  undefined1 local_c0 [96];
  shared_ptr<MethodInfo> local_60;
  shared_ptr<ClassInfo> local_50;
  undefined1 local_39;
  string local_38 [7];
  bool isVisible;
  string variableName;
  CAssignSubscriptStm *stm_local;
  CTypeCheckerVisitor *this_local;
  
  std::operator<<((ostream *)&std::cout,"typechecker: CAssignSubscriptStm\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->idExpression);
  if (((bVar1) &&
      (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->indexExpression), bVar1))
     && (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->valueExpression), bVar1)
     ) {
    pCVar2 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->(&stm->idExpression);
    std::__cxx11::string::string(local_38,(string *)&pCVar2->name);
    std::shared_ptr<ClassInfo>::shared_ptr(&local_50,&this->currentClass);
    std::shared_ptr<MethodInfo>::shared_ptr(&local_60,&this->currentMethod);
    bVar1 = checkVariableVisibility(this,(string *)local_38,&local_50,&local_60);
    std::shared_ptr<MethodInfo>::~shared_ptr(&local_60);
    std::shared_ptr<ClassInfo>::~shared_ptr(&local_50);
    local_39 = bVar1;
    if (bVar1) {
      pIVar3 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                         (&stm->indexExpression);
      (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
      TypeInfo::TypeInfo(&local_118,ERROR_TYPE);
      bVar1 = ::operator==(&this->lastCalculatedType,&local_118);
      TypeInfo::~TypeInfo(&local_118);
      if (bVar1) {
        local_ec = 1;
      }
      else {
        TypeInfo::TypeInfo(&local_140,INT);
        bVar1 = ::operator!=(&this->lastCalculatedType,&local_140);
        TypeInfo::~TypeInfo(&local_140);
        if (bVar1) {
          TypeInfo::TypeInfo(&local_188,INT);
          CError::GetTypeErrorMessage_abi_cxx11_
                    ((CError *)local_160,&local_188,&this->lastCalculatedType);
          TypeInfo::~TypeInfo(&local_188);
          pIVar3 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                             (&stm->indexExpression);
          CError::CError(&local_1b8,(string *)local_160,&(pIVar3->super_PositionedNode).position);
          std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_1b8);
          CError::~CError(&local_1b8);
          TypeInfo::TypeInfo(&local_1e0,ERROR_TYPE);
          TypeInfo::operator=(&this->lastCalculatedType,&local_1e0);
          TypeInfo::~TypeInfo(&local_1e0);
          local_ec = 1;
          std::__cxx11::string::~string((string *)local_160);
        }
        else {
          pIVar3 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                             (&stm->valueExpression);
          (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
          TypeInfo::TypeInfo(&local_208,ERROR_TYPE);
          bVar1 = ::operator==(&this->lastCalculatedType,&local_208);
          TypeInfo::~TypeInfo(&local_208);
          if (bVar1) {
            local_ec = 1;
          }
          else {
            TypeInfo::TypeInfo(&local_230,INT);
            bVar1 = ::operator!=(&this->lastCalculatedType,&local_230);
            TypeInfo::~TypeInfo(&local_230);
            if (bVar1) {
              TypeInfo::TypeInfo(&local_278,INT);
              CError::GetTypeErrorMessage_abi_cxx11_
                        ((CError *)local_250,&local_278,&this->lastCalculatedType);
              TypeInfo::~TypeInfo(&local_278);
              pIVar3 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                                 (&stm->valueExpression);
              CError::CError(&local_2a8,(string *)local_250,&(pIVar3->super_PositionedNode).position
                            );
              std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_2a8);
              CError::~CError(&local_2a8);
              TypeInfo::TypeInfo(&local_2d0,ERROR_TYPE);
              TypeInfo::operator=(&this->lastCalculatedType,&local_2d0);
              TypeInfo::~TypeInfo(&local_2d0);
              local_ec = 1;
              std::__cxx11::string::~string((string *)local_250);
            }
            else {
              TypeInfo::TypeInfo(&local_2f8,VOID);
              TypeInfo::operator=(&this->lastCalculatedType,&local_2f8);
              TypeInfo::~TypeInfo(&local_2f8);
              local_ec = 0;
            }
          }
        }
      }
    }
    else {
      CError::GetUndeclaredErrorMessage((CError *)local_c0,(string *)local_38);
      CError::CError((CError *)(local_c0 + 0x20),(string *)local_c0,
                     &(stm->super_IStatement).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::push_back
                (&this->errors,(value_type *)(local_c0 + 0x20));
      CError::~CError((CError *)(local_c0 + 0x20));
      std::__cxx11::string::~string((string *)local_c0);
      TypeInfo::TypeInfo(&local_e8,ERROR_TYPE);
      TypeInfo::operator=(&this->lastCalculatedType,&local_e8);
      TypeInfo::~TypeInfo(&local_e8);
      local_ec = 1;
    }
    std::__cxx11::string::~string(local_38);
  }
  else {
    CError::CError(&local_328,(string *)CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_328);
    CError::~CError(&local_328);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CAssignSubscriptStm &stm ) 
{
    std::cout << "typechecker: CAssignSubscriptStm\n";

    if( stm.idExpression && stm.indexExpression && stm.valueExpression ) {
        auto variableName = stm.idExpression->name;
        bool isVisible = checkVariableVisibility( variableName, currentClass, currentMethod );
        if( !isVisible ) {
            errors.push_back( CError( CError::GetUndeclaredErrorMessage( variableName ), stm.position ) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
            return;
        }
        stm.indexExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
        if( lastCalculatedType != enums::TPrimitiveType::INT ) {
            auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::INT, lastCalculatedType );
            errors.push_back( CError( errorMessage, stm.indexExpression->position) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
            return;
        }
        stm.valueExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
        if( lastCalculatedType != enums::TPrimitiveType::INT ) {
            auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::INT, lastCalculatedType );
            errors.push_back( CError( errorMessage, stm.valueExpression->position) );
            lastCalculatedType = enums::TPrimitiveType::ERROR_TYPE;
            return;
        }
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position) );
    }
}